

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O3

int __thiscall
deci::parser_t::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (int)*(short *)(yypact_ +
                         (long)(this->yyparser_->yystack_).seq_.
                               super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].
                               super_basic_symbol<deci::parser_t::by_state>.super_by_state.state * 2
                         );
  iVar1 = 0;
  if (iVar5 != -0x14) {
    iVar2 = -iVar5;
    iVar1 = 0;
    if (-1 < *(short *)(yypact_ +
                       (long)(this->yyparser_->yystack_).seq_.
                             super__Vector_base<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].
                             super_basic_symbol<deci::parser_t::by_state>.super_by_state.state * 2))
    {
      iVar2 = 0;
    }
    iVar6 = 0x2c;
    if (0x131 - iVar5 < 0x2c) {
      iVar6 = 0x131 - iVar5;
    }
    if (iVar2 < iVar6) {
      lVar3 = (long)iVar2;
      iVar1 = 0;
      do {
        if (lVar3 != 1) {
          if (((symbol_kind_type)lVar3 == (int)(char)yycheck_[iVar5 + lVar3]) &&
             (yytable_[iVar5 + lVar3] != -1)) {
            if (yyarg == (symbol_kind_type *)0x0) {
              iVar1 = iVar1 + 1;
            }
            else {
              if (iVar1 == yyargn) goto LAB_0010f50c;
              lVar4 = (long)iVar1;
              iVar1 = iVar1 + 1;
              yyarg[lVar4] = (int)(char)yycheck_[iVar5 + lVar3];
            }
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar6);
    }
  }
  if (((0 < yyargn) && (yyarg != (symbol_kind_type *)0x0)) && (iVar1 == 0)) {
    *yyarg = S_YYEMPTY;
LAB_0010f50c:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
   parser_t ::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

    const int yyn = yypact_[+yyparser_.yystack_[0].state];
    if (!yy_pact_value_is_default_ (yyn))
      {
        /* Start YYX at -YYN if negative to avoid negative indexes in
           YYCHECK.  In other words, skip the first -YYN actions for
           this state because they are default actions.  */
        const int yyxbegin = yyn < 0 ? -yyn : 0;
        // Stay within bounds of both yycheck and yytname.
        const int yychecklim = yylast_ - yyn + 1;
        const int yyxend = yychecklim < YYNTOKENS ? yychecklim : YYNTOKENS;
        for (int yyx = yyxbegin; yyx < yyxend; ++yyx)
          if (yycheck_[yyx + yyn] == yyx && yyx != symbol_kind::S_YYerror
              && !yy_table_value_is_error_ (yytable_[yyx + yyn]))
            {
              if (!yyarg)
                ++yycount;
              else if (yycount == yyargn)
                return 0;
              else
                yyarg[yycount++] = YY_CAST (symbol_kind_type, yyx);
            }
      }

    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }